

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExFreakOperator.cpp
# Opt level: O3

void __thiscall lts2::ExFreakOperator::initWithPatchSize(ExFreakOperator *this,Size *patchSize)

{
  uint uVar1;
  ostream *poVar2;
  IntegratingCell *pIVar3;
  BasisFunction *pBVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  uint ring;
  int i;
  uint uVar10;
  long lVar11;
  float fVar12;
  double dVar13;
  float local_78 [12];
  undefined8 local_48;
  float local_40;
  float local_3c;
  Size local_38;
  
  local_38 = *patchSize;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_38);
  iVar6 = (this->super_LBDOperator)._patchSize.width;
  iVar5 = (this->super_LBDOperator)._patchSize.height;
  if (iVar6 < iVar5) {
    iVar5 = iVar6;
  }
  local_78[0] = (float)(iVar5 / 0x19);
  fVar12 = ((float)iVar5 * 22.0) / 1575.0;
  local_78[1] = fVar12 + local_78[0];
  local_78[2] = fVar12 * 3.0 + local_78[0];
  local_78[3] = fVar12 * 6.0 + local_78[0];
  local_78[4] = fVar12 * 10.0 + local_78[0];
  local_78[5] = fVar12 * 15.0 + local_78[0];
  local_78[6] = fVar12 * 21.0 + local_78[0];
  local_78[7] = 0.0;
  local_78[8] = local_78[0] * 0.5;
  local_78[9] = local_78[1] * 0.5;
  local_78[10] = local_78[2] * 0.5;
  local_78[0xb] = local_78[3] * 0.5;
  local_48 = CONCAT44(local_78[5] * 0.5,local_78[4] * 0.5);
  local_40 = local_78[6] * 0.5;
  local_3c = local_78[0] / 3.0;
  lVar11 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ring[",5);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
    poVar2 = std::ostream::_M_insert<double>((double)local_78[lVar11]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<double>((double)local_78[lVar11 + 8]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  (this->super_LBDOperator)._patternPoints = 0x2b;
  pIVar3 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar3 == (IntegratingCell *)0x0) {
    uVar8 = 0x408;
  }
  else {
    operator_delete__(pIVar3);
    uVar8 = (ulong)(this->super_LBDOperator)._patternPoints * 0x18;
  }
  pIVar3 = (IntegratingCell *)operator_new__(uVar8);
  (this->super_LBDOperator)._sensitiveCells = pIVar3;
  puVar9 = FREAKS_CELLS_PER_RING;
  lVar11 = 0;
  do {
    uVar10 = *puVar9;
    dVar13 = (double)uVar10;
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,pIVar3,uVar10,local_78[lVar11 + 8],local_78[lVar11],
               (float)(6.283185307179586 / dVar13),
               (float)((double)(int)lVar11 * (3.141592653589793 / dVar13)));
    pIVar3 = pIVar3 + uVar10;
    lVar11 = lVar11 + 1;
    puVar9 = puVar9 + 1;
  } while (lVar11 != 8);
  uVar10 = (this->super_LBDOperator)._patternPoints;
  uVar1 = (uVar10 - 1) * uVar10 >> 1;
  *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc = uVar1;
  pBVar4 = (this->super_LBDOperator)._basisFunctions;
  if (pBVar4 != (BasisFunction *)0x0) {
    operator_delete__(pBVar4);
    uVar1 = *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
    uVar10 = (this->super_LBDOperator)._patternPoints;
  }
  pBVar4 = (BasisFunction *)operator_new__((ulong)uVar1 << 3);
  (this->super_LBDOperator)._basisFunctions = pBVar4;
  if (1 < uVar10) {
    uVar1 = 1;
    iVar6 = 0;
    do {
      uVar7 = 0;
      do {
        pBVar4[iVar6 + uVar7].pos_cell = uVar7;
        pBVar4[iVar6 + uVar7].neg_cell = uVar1;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      uVar1 = uVar1 + 1;
      iVar6 = iVar6 + uVar7;
    } while (uVar1 != uVar10);
  }
  return;
}

Assistant:

void lts2::ExFreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point

#ifdef DEBUG
    for (int i = 0; i < 8; ++i)
        std::cerr << "ring[" << i << "] = " << ringRadius[i] << " (" << filterSigma[i] << ")" << std::endl;
#endif

    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create all the possible pairs
    _pairsInUse = _patternPoints*(_patternPoints-1)/2;

    /// TODO : fix this ugly hack by a proper init of _basisFunctions in the superclass
    if (_basisFunctions) 
      delete[] _basisFunctions; 

    _basisFunctions = new lbd::BasisFunction[_pairsInUse];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            _basisFunctions[k].pos_cell = i;
            _basisFunctions[k].neg_cell = j;
        }
}